

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O0

vector<HighFreqDataType,_std::allocator<HighFreqDataType>_> * __thiscall
MlmWrap::getHighFreqList(MlmWrap *this)

{
  int iVar1;
  vector<HighFreqDataType,_std::allocator<HighFreqDataType>_> *this_00;
  value_type *__x;
  binarydata *in_RSI;
  HighFreqDataType *in_RDI;
  HighFreqDataType hf;
  zframe_t *f;
  char *first;
  lock_guard<std::mutex> lock;
  zmsg_t *msg;
  vector<HighFreqDataType,_std::allocator<HighFreqDataType>_> *hfdts;
  mutex_type *in_stack_fffffffffffffe78;
  HighFreqDataType *in_stack_fffffffffffffe80;
  HighFreqDataType *s;
  string *in_stack_ffffffffffffff10;
  MlmWrap *in_stack_ffffffffffffff18;
  HighFreqDataType *local_88;
  undefined1 local_7a;
  allocator local_79;
  string local_78 [32];
  string local_58 [32];
  char *local_38;
  zmsg_t *local_18 [3];
  
  s = in_RDI;
  local_18[0] = czhelp_zmsg_create("s","HFDTSLIST",0);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  zactor_send(*(zactor_t **)&in_RSI[2].str,local_18);
  local_18[0] = zactor_recv(*(zactor_t **)&in_RSI[2].str);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x36ea20);
  local_38 = zmsg_popstr(local_18[0]);
  iVar1 = strcmp(local_38,"HFDTSLIST");
  if (iVar1 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"Error retrieving high freq list\n",&local_79);
    error(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    std::operator<<((ostream *)&std::cerr,local_58);
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
  }
  local_7a = 0;
  std::vector<HighFreqDataType,_std::allocator<HighFreqDataType>_>::vector
            ((vector<HighFreqDataType,_std::allocator<HighFreqDataType>_> *)0x36eb81);
  local_88 = (HighFreqDataType *)zmsg_pop(local_18[0]);
  while (local_88 != (HighFreqDataType *)0x0) {
    HighFreqDataType::HighFreqDataType(in_RDI);
    this_00 = (vector<HighFreqDataType,_std::allocator<HighFreqDataType>_> *)
              zframe_data((zframe_t *)local_88);
    __x = (value_type *)zframe_size((zframe_t *)local_88);
    binarydata::binarydata(in_RSI,(char *)s,(size_t)in_RDI);
    HighFreqDataType::decode(in_stack_fffffffffffffe80,(binarydata *)in_stack_fffffffffffffe78);
    binarydata::~binarydata((binarydata *)0x36ec16);
    std::vector<HighFreqDataType,_std::allocator<HighFreqDataType>_>::push_back(this_00,__x);
    zframe_destroy((zframe_t **)&local_88);
    in_stack_fffffffffffffe80 = (HighFreqDataType *)zmsg_pop(local_18[0]);
    local_88 = in_stack_fffffffffffffe80;
    HighFreqDataType::~HighFreqDataType(in_stack_fffffffffffffe80);
  }
  zmsg_destroy(local_18);
  return (vector<HighFreqDataType,_std::allocator<HighFreqDataType>_> *)s;
}

Assistant:

std::vector<HighFreqDataType> MlmWrap::getHighFreqList(){
    zmsg_t *msg = czhelp_zmsg_create("s", hfdtslist, NULL);
    {
        std::lock_guard<std::mutex> lock(actormutex);
        zactor_send(actor, &msg);
        msg = zactor_recv(actor);
    }
    char* first = zmsg_popstr(msg);
    if(!streq(first, hfdtslist)){
        std::cerr << error("Error retrieving high freq list\n");
    }
    std::vector<HighFreqDataType> hfdts;
    zframe_t *f = zmsg_pop(msg);
    while(f){
        HighFreqDataType hf;
        hf.decode(binarydata((char*)zframe_data(f), zframe_size(f)));
        hfdts.push_back(hf);
        zframe_destroy(&f);
        f = zmsg_pop(msg);
    }
    zmsg_destroy(&msg);
    return hfdts;
}